

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::TanH_x86_fma::forward_inplace(TanH_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [24];
  undefined1 auVar47 [16];
  long *in_RSI;
  double dVar48;
  undefined1 auVar49 [32];
  float fVar50;
  float fVar51;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 two;
  __m256 one;
  __m128 two_1;
  __m128 one_3;
  __m256 one_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one_2;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 one_4;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_5;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined8 local_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  int local_17f8;
  undefined8 local_17e8;
  undefined8 local_17e0;
  undefined8 local_17d8;
  undefined4 local_17d0;
  long local_17c8;
  undefined4 local_17c0;
  undefined4 local_17bc;
  undefined4 local_17b8;
  undefined4 local_17b4;
  undefined4 local_17b0;
  undefined8 local_17a8;
  undefined1 (*local_17a0) [32];
  int local_1794;
  int local_1790;
  int local_178c;
  int local_1788;
  int local_1784;
  int local_1780;
  int local_177c;
  long *local_1770;
  undefined1 local_175d;
  int local_175c;
  undefined8 *local_1750;
  undefined8 *local_1748;
  undefined8 *local_1738;
  undefined1 (*local_1728) [32];
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined1 (*local_1690) [32];
  undefined1 (*local_1688) [32];
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 local_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 local_1650;
  undefined8 uStack_1648;
  undefined1 (*local_1640) [32];
  long local_1638;
  undefined4 local_162c;
  long local_1628;
  undefined1 (*local_1620) [32];
  undefined4 local_1614;
  int local_1610;
  int local_160c;
  undefined8 *local_1608;
  undefined4 local_15fc;
  long local_15f8;
  undefined8 *local_15d8;
  undefined4 local_15a8;
  undefined4 local_15a4;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined1 local_1560 [32];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  undefined4 uStack_1504;
  undefined4 local_14e4;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined1 local_14a0 [16];
  undefined1 auStack_1490 [16];
  undefined4 local_1480;
  undefined4 local_147c;
  undefined4 local_1478;
  undefined4 local_1474;
  undefined4 local_1470;
  undefined4 local_146c;
  undefined4 local_1468;
  undefined4 local_1464;
  undefined1 local_1460 [16];
  undefined1 auStack_1450 [16];
  undefined4 local_1440;
  undefined4 local_143c;
  undefined4 local_1438;
  undefined4 local_1434;
  undefined4 local_1430;
  undefined4 local_142c;
  undefined4 local_1428;
  undefined4 local_1424;
  undefined1 local_1420 [16];
  undefined1 auStack_1410 [16];
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  undefined4 local_13f0;
  undefined4 local_13ec;
  undefined4 local_13e8;
  undefined4 local_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1340 [8];
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [32];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [8];
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined1 local_1280 [32];
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  ulong uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined4 local_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined4 local_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined4 local_6e4;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined4 local_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 uStack_6ac;
  undefined4 uStack_6a8;
  undefined4 uStack_6a4;
  undefined4 local_694;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined1 local_680 [16];
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined4 local_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined4 local_5f4;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  ulong uStack_5d8;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [8];
  undefined8 uStack_578;
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 local_520 [16];
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined4 local_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_177c = *(int *)((long)in_RSI + 0x2c);
  local_1780 = (int)in_RSI[6];
  local_1784 = *(int *)((long)in_RSI + 0x34);
  local_1788 = (int)in_RSI[7];
  local_178c = (int)in_RSI[3];
  local_1790 = local_177c * local_1780 * local_1784 * local_178c;
  local_1770 = in_RSI;
  for (local_1794 = 0; local_1794 < local_1788; local_1794 = local_1794 + 1) {
    local_1750 = &local_17e8;
    local_160c = *(int *)((long)local_1770 + 0x2c);
    local_1610 = (int)local_1770[6];
    local_1614 = *(undefined4 *)((long)local_1770 + 0x34);
    local_1620 = (undefined1 (*) [32])
                 (*local_1770 + local_1770[8] * (long)local_1794 * local_1770[2]);
    local_1628 = local_1770[2];
    local_162c = (undefined4)local_1770[3];
    local_1638 = local_1770[4];
    local_1608 = &local_17e8;
    local_15f8 = (long)local_160c * (long)local_1610 * local_1628;
    local_1748 = &local_17e8;
    local_1738 = &local_17e8;
    local_15fc = 0x10;
    local_175c = local_1794;
    local_175d = 1;
    local_17e8 = 0;
    local_17d8 = 0;
    local_17d0 = 0;
    local_17c0 = 0;
    local_17bc = 0;
    local_17b8 = 0;
    local_17b4 = 0;
    local_17b0 = 0;
    local_17a8 = 0;
    local_17e0 = 0;
    local_17a0 = local_1620;
    for (local_17f8 = 0; local_17f8 + 7 < local_1790; local_17f8 = local_17f8 + 8) {
      local_1728 = local_17a0;
      auVar46 = *(undefined1 (*) [24])*local_17a0;
      uStack_16c8 = *(undefined8 *)(*local_17a0 + 0x18);
      local_1820 = auVar46._0_8_;
      local_16e0 = local_1820;
      uStack_1818 = auVar46._8_8_;
      uStack_16d8 = uStack_1818;
      uStack_1810 = auVar46._16_8_;
      uStack_16d0 = uStack_1810;
      local_15a4 = 0x3f800000;
      local_1440 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      local_1460 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auStack_1450 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      local_1700 = local_1460._0_8_;
      uStack_16f8 = local_1460._8_8_;
      uStack_16f0 = auStack_1450._0_8_;
      uStack_16e8 = auStack_1450._8_8_;
      local_15a8 = 0x40000000;
      local_1400 = 0x40000000;
      auVar1 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x20);
      local_1420 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x20);
      auStack_1410 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x30);
      local_1720 = local_1420._0_8_;
      uStack_1718 = local_1420._8_8_;
      uStack_1710 = auStack_1410._0_8_;
      uStack_1708 = auStack_1410._8_8_;
      uVar7 = local_1820;
      uVar8 = uStack_1818;
      local_14c0._0_4_ = auVar46._0_4_;
      local_14c0._4_4_ = auVar46._4_4_;
      uStack_14b8._0_4_ = auVar46._8_4_;
      uStack_14b8._4_4_ = auVar46._12_4_;
      uStack_14b0._0_4_ = auVar46._16_4_;
      uStack_14b0._4_4_ = auVar46._20_4_;
      uStack_14a8._0_4_ = (float)uStack_16c8;
      uStack_14a8._4_4_ = (undefined4)((ulong)uStack_16c8 >> 0x20);
      uStack_1504 = uStack_14a8._4_4_;
      local_14e0._0_4_ = local_1420._0_4_;
      local_14e0._4_4_ = local_1420._4_4_;
      uStack_14d8._0_4_ = local_1420._8_4_;
      uStack_14d8._4_4_ = local_1420._12_4_;
      uStack_14d0._0_4_ = auStack_1410._0_4_;
      uStack_14d0._4_4_ = auStack_1410._4_4_;
      uStack_14c8._0_4_ = auStack_1410._8_4_;
      local_1520 = (float)local_14c0 * (float)local_14e0;
      fStack_151c = local_14c0._4_4_ * local_14e0._4_4_;
      fStack_1518 = (float)uStack_14b8 * (float)uStack_14d8;
      fStack_1514 = uStack_14b8._4_4_ * uStack_14d8._4_4_;
      fStack_1510 = (float)uStack_14b0 * (float)uStack_14d0;
      fStack_150c = uStack_14b0._4_4_ * uStack_14d0._4_4_;
      fStack_1508 = (float)uStack_14a8 * (float)uStack_14c8;
      local_14e4 = 0x3f800000;
      local_1480 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      local_14a0 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auStack_1490 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      local_1540._0_4_ = local_14a0._0_4_;
      local_13c0 = (float)local_1540;
      local_1540._4_4_ = local_14a0._4_4_;
      fStack_13bc = local_1540._4_4_;
      uStack_1538._0_4_ = local_14a0._8_4_;
      fStack_13b8 = (float)uStack_1538;
      uStack_1538._4_4_ = local_14a0._12_4_;
      fStack_13b4 = uStack_1538._4_4_;
      uStack_1530._0_4_ = auStack_1490._0_4_;
      fStack_13b0 = (float)uStack_1530;
      uStack_1530._4_4_ = auStack_1490._4_4_;
      fStack_13ac = uStack_1530._4_4_;
      uStack_1528._0_4_ = auStack_1490._8_4_;
      fStack_13a8 = (float)uStack_1528;
      uStack_1528._4_4_ = auStack_1490._12_4_;
      fStack_13a4 = uStack_1528._4_4_;
      local_1120 = ZEXT832(0) << 0x20;
      local_1140 = 0;
      local_1100._8_8_ = SUB328(ZEXT832(0),4);
      uStack_1138 = local_1100._8_8_;
      uStack_1130 = 0;
      uStack_1128 = 0;
      local_1160 = CONCAT44(fStack_151c,local_1520);
      uStack_1158 = CONCAT44(fStack_1514,fStack_1518);
      uStack_1150 = CONCAT44(fStack_150c,fStack_1510);
      uStack_1148 = CONCAT44(uStack_14a8._4_4_,fStack_1508);
      auVar12._8_8_ = uStack_1158;
      auVar12._0_8_ = local_1160;
      auVar12._16_8_ = uStack_1150;
      auVar12._24_8_ = uStack_1148;
      auVar5 = vsubps_avx(ZEXT832((ulong)local_1100._8_8_) << 0x40,auVar12);
      local_1300 = 0x3f8000003f800000;
      uStack_12f8 = 0x3f8000003f800000;
      uStack_12f0 = 0x3f8000003f800000;
      uStack_12e8 = 0x3f8000003f800000;
      local_1280._0_8_ = auVar5._0_8_;
      local_10c0 = local_1280._0_8_;
      local_1280._8_8_ = auVar5._8_8_;
      uStack_10b8 = local_1280._8_8_;
      local_1280._16_8_ = auVar5._16_8_;
      uStack_10b0 = local_1280._16_8_;
      local_1280._24_8_ = auVar5._24_8_;
      uStack_10a8 = local_1280._24_8_;
      local_10e0 = 0x42b0c0a542b0c0a5;
      uStack_10d8 = 0x42b0c0a542b0c0a5;
      uStack_10d0 = 0x42b0c0a542b0c0a5;
      uStack_10c8 = 0x42b0c0a542b0c0a5;
      auVar13._8_8_ = 0x42b0c0a542b0c0a5;
      auVar13._0_8_ = 0x42b0c0a542b0c0a5;
      auVar13._16_8_ = 0x42b0c0a542b0c0a5;
      auVar13._24_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(auVar5,auVar13);
      local_1280._0_8_ = auVar5._0_8_;
      local_1080 = local_1280._0_8_;
      local_1280._8_8_ = auVar5._8_8_;
      uStack_1078 = local_1280._8_8_;
      local_1280._16_8_ = auVar5._16_8_;
      uStack_1070 = local_1280._16_8_;
      local_1280._24_8_ = auVar5._24_8_;
      uStack_1068 = local_1280._24_8_;
      local_10a0 = 0xc2b0c0a5c2b0c0a5;
      uStack_1098 = 0xc2b0c0a5c2b0c0a5;
      uStack_1090 = 0xc2b0c0a5c2b0c0a5;
      uStack_1088 = 0xc2b0c0a5c2b0c0a5;
      auVar14._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar14._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar14._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar14._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar5,auVar14);
      local_1280._0_8_ = auVar3._0_8_;
      local_de0 = local_1280._0_8_;
      local_1280._8_8_ = auVar3._8_8_;
      uStack_dd8 = local_1280._8_8_;
      local_1280._16_8_ = auVar3._16_8_;
      uStack_dd0 = local_1280._16_8_;
      local_1280._24_8_ = auVar3._24_8_;
      uStack_dc8 = local_1280._24_8_;
      local_e00 = 0x3fb8aa3b3fb8aa3b;
      uStack_df8 = 0x3fb8aa3b3fb8aa3b;
      uStack_df0 = 0x3fb8aa3b3fb8aa3b;
      uStack_de8 = 0x3fb8aa3b3fb8aa3b;
      local_1000 = 0x3f0000003f000000;
      uStack_ff8 = 0x3f0000003f000000;
      uStack_ff0 = 0x3f0000003f000000;
      uStack_fe8 = 0x3f0000003f000000;
      local_a80 = local_1280._0_8_;
      uStack_a78 = local_1280._8_8_;
      uStack_a70 = local_1280._16_8_;
      uStack_a68 = local_1280._24_8_;
      local_aa0 = 0x3fb8aa3b3fb8aa3b;
      uStack_a98 = 0x3fb8aa3b3fb8aa3b;
      uStack_a90 = 0x3fb8aa3b3fb8aa3b;
      uStack_a88 = 0x3fb8aa3b3fb8aa3b;
      local_ac0 = 0x3f0000003f000000;
      uStack_ab8 = 0x3f0000003f000000;
      uStack_ab0 = 0x3f0000003f000000;
      uStack_aa8 = 0x3f0000003f000000;
      auVar17._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar17._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar17._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar17._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar16._8_8_ = 0x3f0000003f000000;
      auVar16._0_8_ = 0x3f0000003f000000;
      auVar16._16_8_ = 0x3f0000003f000000;
      auVar16._24_8_ = 0x3f0000003f000000;
      auVar1 = vfmadd213ps_fma(auVar17,auVar3,auVar16);
      auVar4 = vroundps_avx(ZEXT1632(auVar1),1);
      auVar5 = vcmpps_avx(ZEXT1632(auVar1),auVar4,1);
      local_1320._0_8_ = auVar5._0_8_;
      local_da0 = local_1320._0_8_;
      local_1320._8_8_ = auVar5._8_8_;
      uStack_d98 = local_1320._8_8_;
      local_1320._16_8_ = auVar5._16_8_;
      uStack_d90 = local_1320._16_8_;
      local_1320._24_8_ = auVar5._24_8_;
      uStack_d88 = local_1320._24_8_;
      local_dc0 = 0x3f8000003f800000;
      uStack_db8 = 0x3f8000003f800000;
      uStack_db0 = 0x3f8000003f800000;
      uStack_da8 = 0x3f8000003f800000;
      auVar15._8_8_ = 0x3f8000003f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._16_8_ = 0x3f8000003f800000;
      auVar15._24_8_ = 0x3f8000003f800000;
      local_1320 = vandps_avx(auVar5,auVar15);
      local_12a0 = auVar4._0_8_;
      local_1180 = local_12a0;
      uStack_1298 = auVar4._8_8_;
      uStack_1178 = uStack_1298;
      uStack_1290 = auVar4._16_8_;
      uStack_1170 = uStack_1290;
      uStack_1288 = auVar4._24_8_;
      uStack_1168 = uStack_1288;
      local_11a0 = local_1320._0_8_;
      uStack_1198 = local_1320._8_8_;
      uStack_1190 = local_1320._16_8_;
      uStack_1188 = local_1320._24_8_;
      local_12c0 = vsubps_avx(auVar4,local_1320);
      local_ce0 = local_12c0._0_8_;
      uStack_cd8 = local_12c0._8_8_;
      uStack_cd0 = local_12c0._16_8_;
      uStack_cc8 = local_12c0._24_8_;
      local_d20 = local_1280._0_8_;
      uStack_d18 = local_1280._8_8_;
      uStack_d10 = local_1280._16_8_;
      uStack_d08 = local_1280._24_8_;
      local_d00 = 0x3f3180003f318000;
      uStack_cf8 = 0x3f3180003f318000;
      uStack_cf0 = 0x3f3180003f318000;
      uStack_ce8 = 0x3f3180003f318000;
      local_7e0 = local_12c0._0_8_;
      uStack_7d8 = local_12c0._8_8_;
      uStack_7d0 = local_12c0._16_8_;
      uStack_7c8 = local_12c0._24_8_;
      local_800 = 0x3f3180003f318000;
      uStack_7f8 = 0x3f3180003f318000;
      uStack_7f0 = 0x3f3180003f318000;
      uStack_7e8 = 0x3f3180003f318000;
      local_820 = local_1280._0_8_;
      uStack_818 = local_1280._8_8_;
      uStack_810 = local_1280._16_8_;
      uStack_808 = local_1280._24_8_;
      auVar24._8_8_ = 0x3f3180003f318000;
      auVar24._0_8_ = 0x3f3180003f318000;
      auVar24._16_8_ = 0x3f3180003f318000;
      auVar24._24_8_ = 0x3f3180003f318000;
      auVar1 = vfnmadd213ps_fma(auVar24,local_12c0,auVar3);
      local_d40 = local_12c0._0_8_;
      uStack_d38 = local_12c0._8_8_;
      uStack_d30 = local_12c0._16_8_;
      uStack_d28 = local_12c0._24_8_;
      local_1280._0_8_ = auVar1._0_8_;
      local_d80 = local_1280._0_8_;
      local_1280._8_8_ = auVar1._8_8_;
      uStack_d78 = local_1280._8_8_;
      uStack_d70 = 0;
      uStack_d68 = 0;
      local_d60 = 0xb95e8083b95e8083;
      uStack_d58 = 0xb95e8083b95e8083;
      uStack_d50 = 0xb95e8083b95e8083;
      uStack_d48 = 0xb95e8083b95e8083;
      local_780 = local_12c0._0_8_;
      uStack_778 = local_12c0._8_8_;
      uStack_770 = local_12c0._16_8_;
      uStack_768 = local_12c0._24_8_;
      local_7a0 = 0xb95e8083b95e8083;
      uStack_798 = 0xb95e8083b95e8083;
      uStack_790 = 0xb95e8083b95e8083;
      uStack_788 = 0xb95e8083b95e8083;
      local_7c0 = local_1280._0_8_;
      uStack_7b8 = local_1280._8_8_;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      auVar25._8_8_ = 0xb95e8083b95e8083;
      auVar25._0_8_ = 0xb95e8083b95e8083;
      auVar25._16_8_ = 0xb95e8083b95e8083;
      auVar25._24_8_ = 0xb95e8083b95e8083;
      auVar6 = vfnmadd213ps_fma(auVar25,local_12c0,ZEXT1632(auVar1));
      local_1280._0_8_ = auVar6._0_8_;
      local_1220 = local_1280._0_8_;
      local_1280._8_8_ = auVar6._8_8_;
      uStack_1218 = local_1280._8_8_;
      uStack_1210 = 0;
      uStack_1208 = 0;
      local_1200._0_4_ = auVar6._0_4_;
      local_1200._4_4_ = auVar6._4_4_;
      uStack_11f8._0_4_ = auVar6._8_4_;
      uStack_11f8._4_4_ = auVar6._12_4_;
      local_12a0._4_4_ = local_1200._4_4_ * local_1200._4_4_;
      local_12a0._0_4_ = (float)local_1200 * (float)local_1200;
      local_1040 = local_12a0;
      uStack_1298._0_4_ = (float)uStack_11f8 * (float)uStack_11f8;
      uStack_1298._4_4_ = uStack_11f8._4_4_ * uStack_11f8._4_4_;
      auVar2 = _local_12a0;
      _local_12a0 = ZEXT1632(_local_12a0);
      auVar13 = _local_12a0;
      uStack_1338 = 0x3950696739506967;
      local_1340 = (undefined1  [8])0x3950696739506967;
      local_e40 = 0x3950696739506967;
      uStack_e38 = 0x3950696739506967;
      uStack_e30 = 0x3950696739506967;
      uStack_e28 = 0x3950696739506967;
      local_e60 = local_1280._0_8_;
      uStack_e58 = local_1280._8_8_;
      uStack_e50 = 0;
      uStack_e48 = 0;
      local_e80 = 0x3ab743ce3ab743ce;
      uStack_e78 = 0x3ab743ce3ab743ce;
      uStack_e70 = 0x3ab743ce3ab743ce;
      uStack_e68 = 0x3ab743ce3ab743ce;
      local_a20 = 0x3950696739506967;
      uStack_a18 = 0x3950696739506967;
      uStack_a10 = 0x3950696739506967;
      uStack_a08 = 0x3950696739506967;
      local_a40 = local_1280._0_8_;
      uStack_a38 = local_1280._8_8_;
      uStack_a30 = 0;
      uStack_a28 = 0;
      local_a60 = 0x3ab743ce3ab743ce;
      uStack_a58 = 0x3ab743ce3ab743ce;
      uStack_a50 = 0x3ab743ce3ab743ce;
      uStack_a48 = 0x3ab743ce3ab743ce;
      auVar19._16_8_ = 0x3950696739506967;
      auVar19._0_16_ = _local_1340;
      auVar19._24_8_ = 0x3950696739506967;
      auVar18._8_8_ = 0x3ab743ce3ab743ce;
      auVar18._0_8_ = 0x3ab743ce3ab743ce;
      auVar18._16_8_ = 0x3ab743ce3ab743ce;
      auVar18._24_8_ = 0x3ab743ce3ab743ce;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar19,auVar18);
      local_1340 = auVar1._0_8_;
      local_ea0 = local_1340;
      uStack_1338 = auVar1._8_8_;
      uStack_e98 = uStack_1338;
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_ec0 = local_1280._0_8_;
      uStack_eb8 = local_1280._8_8_;
      uStack_eb0 = 0;
      uStack_ea8 = 0;
      local_ee0 = 0x3c0889083c088908;
      uStack_ed8 = 0x3c0889083c088908;
      uStack_ed0 = 0x3c0889083c088908;
      uStack_ec8 = 0x3c0889083c088908;
      local_9c0 = local_1340;
      uStack_9b8 = uStack_1338;
      uStack_9b0 = 0;
      uStack_9a8 = 0;
      local_9e0 = local_1280._0_8_;
      uStack_9d8 = local_1280._8_8_;
      uStack_9d0 = 0;
      uStack_9c8 = 0;
      local_a00 = 0x3c0889083c088908;
      uStack_9f8 = 0x3c0889083c088908;
      uStack_9f0 = 0x3c0889083c088908;
      uStack_9e8 = 0x3c0889083c088908;
      auVar20._8_8_ = 0x3c0889083c088908;
      auVar20._0_8_ = 0x3c0889083c088908;
      auVar20._16_8_ = 0x3c0889083c088908;
      auVar20._24_8_ = 0x3c0889083c088908;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar20);
      local_1340 = auVar1._0_8_;
      local_f00 = local_1340;
      uStack_1338 = auVar1._8_8_;
      uStack_ef8 = uStack_1338;
      uStack_ef0 = 0;
      uStack_ee8 = 0;
      local_f20 = local_1280._0_8_;
      uStack_f18 = local_1280._8_8_;
      uStack_f10 = 0;
      uStack_f08 = 0;
      local_f40 = 0x3d2aa9c13d2aa9c1;
      uStack_f38 = 0x3d2aa9c13d2aa9c1;
      uStack_f30 = 0x3d2aa9c13d2aa9c1;
      uStack_f28 = 0x3d2aa9c13d2aa9c1;
      local_960 = local_1340;
      uStack_958 = uStack_1338;
      uStack_950 = 0;
      uStack_948 = 0;
      local_980 = local_1280._0_8_;
      uStack_978 = local_1280._8_8_;
      uStack_970 = 0;
      uStack_968 = 0;
      local_9a0 = 0x3d2aa9c13d2aa9c1;
      uStack_998 = 0x3d2aa9c13d2aa9c1;
      uStack_990 = 0x3d2aa9c13d2aa9c1;
      uStack_988 = 0x3d2aa9c13d2aa9c1;
      auVar21._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar21._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar21._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar21._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar21);
      local_1340 = auVar1._0_8_;
      local_f60 = local_1340;
      uStack_1338 = auVar1._8_8_;
      uStack_f58 = uStack_1338;
      uStack_f50 = 0;
      uStack_f48 = 0;
      local_f80 = local_1280._0_8_;
      uStack_f78 = local_1280._8_8_;
      uStack_f70 = 0;
      uStack_f68 = 0;
      local_fa0 = 0x3e2aaaaa3e2aaaaa;
      uStack_f98 = 0x3e2aaaaa3e2aaaaa;
      uStack_f90 = 0x3e2aaaaa3e2aaaaa;
      uStack_f88 = 0x3e2aaaaa3e2aaaaa;
      local_900 = local_1340;
      uStack_8f8 = uStack_1338;
      uStack_8f0 = 0;
      uStack_8e8 = 0;
      local_920 = local_1280._0_8_;
      uStack_918 = local_1280._8_8_;
      uStack_910 = 0;
      uStack_908 = 0;
      local_940 = 0x3e2aaaaa3e2aaaaa;
      uStack_938 = 0x3e2aaaaa3e2aaaaa;
      uStack_930 = 0x3e2aaaaa3e2aaaaa;
      uStack_928 = 0x3e2aaaaa3e2aaaaa;
      auVar22._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar22._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar22._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar22._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar22);
      local_1340 = auVar1._0_8_;
      local_fc0 = local_1340;
      uStack_1338 = auVar1._8_8_;
      uStack_fb8 = uStack_1338;
      uStack_fb0 = 0;
      uStack_fa8 = 0;
      local_fe0 = local_1280._0_8_;
      uStack_fd8 = local_1280._8_8_;
      uStack_fd0 = 0;
      uStack_fc8 = 0;
      local_8a0 = local_1340;
      uStack_898 = uStack_1338;
      uStack_890 = 0;
      uStack_888 = 0;
      local_8c0 = local_1280._0_8_;
      uStack_8b8 = local_1280._8_8_;
      uStack_8b0 = 0;
      uStack_8a8 = 0;
      local_8e0 = 0x3f0000003f000000;
      uStack_8d8 = 0x3f0000003f000000;
      uStack_8d0 = 0x3f0000003f000000;
      uStack_8c8 = 0x3f0000003f000000;
      auVar23._8_8_ = 0x3f0000003f000000;
      auVar23._0_8_ = 0x3f0000003f000000;
      auVar23._16_8_ = 0x3f0000003f000000;
      auVar23._24_8_ = 0x3f0000003f000000;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar23);
      local_1340 = auVar1._0_8_;
      local_1020 = local_1340;
      uStack_1338 = auVar1._8_8_;
      uStack_1018 = uStack_1338;
      uStack_1010 = 0;
      uStack_1008 = 0;
      uStack_1298 = auVar2._8_8_;
      uStack_1038 = uStack_1298;
      uStack_1030 = 0;
      uStack_1028 = 0;
      local_1060 = local_1280._0_8_;
      uStack_1058 = local_1280._8_8_;
      uStack_1050 = 0;
      uStack_1048 = 0;
      local_840 = local_1340;
      uStack_838 = uStack_1338;
      uStack_830 = 0;
      uStack_828 = 0;
      local_860 = local_1040;
      uStack_858 = uStack_1298;
      uStack_850 = 0;
      uStack_848 = 0;
      local_880 = local_1280._0_8_;
      uStack_878 = local_1280._8_8_;
      uStack_870 = 0;
      uStack_868 = 0;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar1),ZEXT1632(auVar6));
      local_1340 = auVar1._0_8_;
      uVar9 = local_1340;
      uStack_1338 = auVar1._8_8_;
      uVar10 = uStack_1338;
      uStack_11b0 = 0;
      uStack_11a8 = 0;
      local_11e0 = 0x3f8000003f800000;
      uStack_11d8 = 0x3f8000003f800000;
      uStack_11d0 = 0x3f8000003f800000;
      uStack_11c8 = 0x3f8000003f800000;
      local_11c0._0_4_ = auVar1._0_4_;
      local_11c0._4_4_ = auVar1._4_4_;
      uStack_11b8._0_4_ = auVar1._8_4_;
      uStack_11b8._4_4_ = auVar1._12_4_;
      local_1340._4_4_ = local_11c0._4_4_ + 1.0;
      local_1340._0_4_ = (float)local_11c0 + 1.0;
      uStack_1338._0_4_ = (float)uStack_11b8 + 1.0;
      uStack_1338._4_4_ = uStack_11b8._4_4_ + 1.0;
      uStack_1330._0_4_ = 0x3f800000;
      uStack_1330._4_4_ = 0x3f800000;
      auVar46 = _local_1340;
      uStack_1328._0_4_ = 0x3f800000;
      uStack_1328._4_4_ = 0x3f800000;
      auVar5 = _local_1340;
      local_cc0._0_4_ = local_12c0._0_4_;
      local_cc0._4_4_ = local_12c0._4_4_;
      uStack_cb8._0_4_ = local_12c0._8_4_;
      uStack_cb8._4_4_ = local_12c0._12_4_;
      uStack_cb0._0_4_ = local_12c0._16_4_;
      uStack_cb0._4_4_ = local_12c0._20_4_;
      uStack_ca8._0_4_ = local_12c0._24_4_;
      uStack_ca8._4_4_ = local_12c0._28_4_;
      local_12e0 = CONCAT44((int)local_cc0._4_4_,(int)(float)local_cc0);
      uStack_12d8 = CONCAT44((int)uStack_cb8._4_4_,(int)(float)uStack_cb8);
      uStack_12d0 = CONCAT44((int)uStack_cb0._4_4_,(int)(float)uStack_cb0);
      uStack_12c8 = CONCAT44((int)uStack_ca8._4_4_,(int)(float)uStack_ca8);
      local_bc0 = local_12e0;
      uStack_bb8 = uStack_12d8;
      uStack_bb0 = uStack_12d0;
      uStack_ba8 = uStack_12c8;
      local_be0 = 0x7f0000007f;
      uStack_bd8 = 0x7f0000007f;
      uStack_bd0 = 0x7f0000007f;
      uStack_bc8 = 0x7f0000007f;
      local_c60 = local_12e0;
      uStack_c58 = uStack_12d8;
      uStack_c50 = uStack_12d0;
      uStack_c48 = uStack_12c8;
      local_c80 = 0x7f0000007f;
      uStack_c78 = 0x7f0000007f;
      uStack_c70 = 0x7f0000007f;
      uStack_c68 = 0x7f0000007f;
      local_c10 = 0x7f0000007f;
      uStack_c08 = 0x7f0000007f;
      local_c20 = 0x7f0000007f;
      uStack_c18 = 0x7f0000007f;
      local_720 = local_12e0;
      uStack_718 = uStack_12d8;
      local_730 = 0x7f0000007f;
      uStack_728 = 0x7f0000007f;
      auVar27._8_8_ = uStack_12d8;
      auVar27._0_8_ = local_12e0;
      auVar26._8_8_ = 0x7f0000007f;
      auVar26._0_8_ = 0x7f0000007f;
      local_bf0 = vpaddd_avx(auVar27,auVar26);
      local_740 = uStack_12d0;
      uStack_738 = uStack_12c8;
      local_750 = 0x7f0000007f;
      uStack_748 = 0x7f0000007f;
      auVar2._8_8_ = uStack_12c8;
      auVar2._0_8_ = uStack_12d0;
      auVar1._8_8_ = 0x7f0000007f;
      auVar1._0_8_ = 0x7f0000007f;
      local_c00 = vpaddd_avx(auVar2,auVar1);
      local_ca0 = local_bf0._0_8_;
      uStack_c98 = local_bf0._8_8_;
      uStack_c90 = local_c00._0_8_;
      uStack_c88 = local_c00._8_8_;
      local_c40 = local_bf0._0_8_;
      uStack_c38 = local_bf0._8_8_;
      uStack_c30 = local_c00._0_8_;
      uStack_c28 = local_c00._8_8_;
      local_b00 = local_bf0._0_8_;
      uStack_af8 = local_bf0._8_8_;
      uStack_af0 = local_c00._0_8_;
      uStack_ae8 = local_c00._8_8_;
      local_b04 = 0x17;
      local_b80 = local_bf0._0_8_;
      uStack_b78 = local_bf0._8_8_;
      uStack_b70 = local_c00._0_8_;
      uStack_b68 = local_c00._8_8_;
      local_6e0 = local_bf0._0_8_;
      uStack_6d8 = local_bf0._8_8_;
      local_6e4 = 0x17;
      local_b20 = vpslld_avx(local_bf0,ZEXT416(0x17));
      local_700 = local_c00._0_8_;
      uStack_6f8 = local_c00._8_8_;
      local_704 = 0x17;
      local_b30 = vpslld_avx(local_c00,ZEXT416(0x17));
      local_ba0 = local_b20._0_8_;
      uStack_b98 = local_b20._8_8_;
      uStack_b90 = local_b30._0_8_;
      uStack_b88 = local_b30._8_8_;
      local_b60 = local_b20._0_8_;
      uStack_b58 = local_b20._8_8_;
      uStack_b50 = local_b30._0_8_;
      uStack_b48 = local_b30._8_8_;
      local_12e0 = local_b20._0_8_;
      uStack_12d8 = local_b20._8_8_;
      uStack_12d0 = local_b30._0_8_;
      uStack_12c8 = local_b30._8_8_;
      local_ae0 = local_b20._0_8_;
      uStack_ad8 = local_b20._8_8_;
      uStack_ad0 = local_b30._0_8_;
      uStack_ac8 = local_b30._8_8_;
      local_1360 = local_b20._0_8_;
      uStack_1358 = local_b20._8_8_;
      uStack_1350 = local_b30._0_8_;
      uStack_1348 = local_b30._8_8_;
      local_1240 = local_1340;
      uStack_1238 = uStack_1338;
      uStack_1330 = auVar46._16_8_;
      uStack_1230 = uStack_1330;
      uStack_1328 = auVar5._24_8_;
      uStack_1228 = uStack_1328;
      local_1260._0_4_ = local_b20._0_4_;
      local_1260._4_4_ = local_b20._4_4_;
      uStack_1258._0_4_ = local_b20._8_4_;
      uStack_1258._4_4_ = local_b20._12_4_;
      uStack_1250._0_4_ = local_b30._0_4_;
      uStack_1250._4_4_ = local_b30._4_4_;
      uStack_1248._0_4_ = local_b30._8_4_;
      local_1340._0_4_ = ((float)local_11c0 + 1.0) * (float)local_1260;
      local_1340._4_4_ = (local_11c0._4_4_ + 1.0) * local_1260._4_4_;
      uStack_1258._0_4_ = ((float)uStack_11b8 + 1.0) * (float)uStack_1258;
      uStack_1258._4_4_ = (uStack_11b8._4_4_ + 1.0) * uStack_1258._4_4_;
      uStack_1338._0_4_ = (float)uStack_1258;
      uStack_1338._4_4_ = uStack_1258._4_4_;
      uStack_1330._0_4_ = (float)uStack_1250 * 1.0;
      uStack_1330._4_4_ = uStack_1250._4_4_ * 1.0;
      auVar46 = _local_1340;
      uStack_1328._0_4_ = (float)uStack_1248 * 1.0;
      uStack_1328._4_4_ = 0x3f800000;
      auVar12 = _local_1340;
      local_13a0 = local_1340;
      uStack_1398 = uStack_1338;
      uStack_1330 = auVar46._16_8_;
      uStack_1390 = uStack_1330;
      uStack_1328 = auVar12._24_8_;
      uStack_1388 = uStack_1328;
      local_13e0 = (float)local_1540 + (float)local_1340._0_4_;
      fStack_13dc = local_1540._4_4_ + (float)local_1340._4_4_;
      fStack_13d8 = (float)uStack_1538 + (float)uStack_1258;
      fStack_13d4 = uStack_1538._4_4_ + uStack_1258._4_4_;
      fStack_13d0 = (float)uStack_1530 + (float)uStack_1250 * 1.0;
      fStack_13cc = uStack_1530._4_4_ + uStack_1250._4_4_ * 1.0;
      fStack_13c8 = (float)uStack_1528 + (float)uStack_1248 * 1.0;
      fStack_13c4 = uStack_1528._4_4_ + 1.0;
      auVar11._16_4_ = (float)uStack_1530;
      auVar11._0_16_ = local_14a0;
      auVar11._20_4_ = uStack_1530._4_4_;
      auVar11._24_4_ = (float)uStack_1528;
      auVar11._28_4_ = uStack_1528._4_4_;
      auVar4._4_4_ = fStack_13dc;
      auVar4._0_4_ = local_13e0;
      auVar4._8_4_ = fStack_13d8;
      auVar4._12_4_ = fStack_13d4;
      auVar4._16_4_ = fStack_13d0;
      auVar4._20_4_ = fStack_13cc;
      auVar4._24_4_ = fStack_13c8;
      auVar4._28_4_ = fStack_13c4;
      auVar5 = vrcpps_avx(auVar4);
      auVar3._4_4_ = local_1540._4_4_ * auVar5._4_4_;
      auVar3._0_4_ = (float)local_1540 * auVar5._0_4_;
      auVar3._8_4_ = (float)uStack_1538 * auVar5._8_4_;
      auVar3._12_4_ = uStack_1538._4_4_ * auVar5._12_4_;
      auVar3._16_4_ = (float)uStack_1530 * auVar5._16_4_;
      auVar3._20_4_ = uStack_1530._4_4_ * auVar5._20_4_;
      auVar3._24_4_ = (float)uStack_1528 * auVar5._24_4_;
      auVar3._28_4_ = uStack_1528._4_4_;
      auVar1 = vfmsub213ps_fma(auVar3,auVar4,auVar11);
      auVar1 = vfnmadd213ps_fma(ZEXT1632(auVar1),auVar5,auVar3);
      local_1580 = local_1420._0_8_;
      uStack_1578 = local_1420._8_8_;
      uStack_1570 = auStack_1410._0_8_;
      uStack_1568 = auStack_1410._8_8_;
      local_1560 = ZEXT1632(auVar1);
      auVar5._16_8_ = auStack_1410._0_8_;
      auVar5._0_16_ = local_1420;
      auVar5._24_8_ = auStack_1410._8_8_;
      local_15a0._0_4_ = local_1460._0_4_;
      local_15a0._4_4_ = local_1460._4_4_;
      uStack_1598._0_4_ = local_1460._8_4_;
      uStack_1598._4_4_ = local_1460._12_4_;
      uStack_1590._0_4_ = auStack_1450._0_4_;
      uStack_1590._4_4_ = auStack_1450._4_4_;
      uStack_1588._0_4_ = auStack_1450._8_4_;
      uStack_1588._4_4_ = auStack_1450._12_4_;
      auVar49._0_4_ = (uint)local_15a0 ^ (uint)DAT_01f0ca80;
      auVar49._4_4_ = local_15a0._4_4_ ^ DAT_01f0ca80._4_4_;
      auVar49._8_4_ = (uint)uStack_1598 ^ DAT_01f0ca80._8_4_;
      auVar49._12_4_ = uStack_1598._4_4_ ^ DAT_01f0ca80._12_4_;
      auVar49._16_4_ = (uint)uStack_1590 ^ DAT_01f0ca80._16_4_;
      auVar49._20_4_ = uStack_1590._4_4_ ^ DAT_01f0ca80._20_4_;
      auVar49._24_4_ = (uint)uStack_1588 ^ DAT_01f0ca80._24_4_;
      auVar49._28_4_ = uStack_1588._4_4_ ^ DAT_01f0ca80._28_4_;
      auVar1 = vfmadd213ps_fma(auVar5,local_1560,auVar49);
      local_1690 = local_17a0;
      local_1820 = auVar1._0_8_;
      local_16c0 = local_1820;
      uStack_1818 = auVar1._8_8_;
      uStack_16b8 = uStack_1818;
      uStack_16b0 = 0;
      uStack_16a8 = 0;
      *local_17a0 = ZEXT1632(auVar1);
      local_17a0 = local_17a0 + 1;
      local_15a0 = local_1460._0_8_;
      uStack_1598 = local_1460._8_8_;
      uStack_1590 = auStack_1450._0_8_;
      uStack_1588 = auStack_1450._8_8_;
      local_1540 = local_14a0._0_8_;
      uStack_1538 = local_14a0._8_8_;
      uStack_1530 = auStack_1490._0_8_;
      uStack_1528 = auStack_1490._8_8_;
      local_14e0 = local_1420._0_8_;
      uStack_14d8 = local_1420._8_8_;
      uStack_14d0 = auStack_1410._0_8_;
      uStack_14c8 = auStack_1410._8_8_;
      local_14c0 = uVar7;
      uStack_14b8 = uVar8;
      uStack_14b0 = uStack_1810;
      uStack_14a8 = uStack_16c8;
      local_147c = local_1480;
      local_1478 = local_1480;
      local_1474 = local_1480;
      local_1470 = local_1480;
      local_146c = local_1480;
      local_1468 = local_1480;
      local_1464 = local_1480;
      local_143c = local_1440;
      local_1438 = local_1440;
      local_1434 = local_1440;
      local_1430 = local_1440;
      local_142c = local_1440;
      local_1428 = local_1440;
      local_1424 = local_1440;
      local_13fc = local_1400;
      local_13f8 = local_1400;
      local_13f4 = local_1400;
      local_13f0 = local_1400;
      local_13ec = local_1400;
      local_13e8 = local_1400;
      local_13e4 = local_1400;
      local_1380 = local_13c0;
      fStack_137c = fStack_13bc;
      fStack_1378 = fStack_13b8;
      fStack_1374 = fStack_13b4;
      fStack_1370 = fStack_13b0;
      fStack_136c = fStack_13ac;
      fStack_1368 = fStack_13a8;
      fStack_1364 = fStack_13a4;
      _local_1340 = auVar12;
      _local_12a0 = auVar13;
      local_1280 = ZEXT1632(auVar6);
      local_1260 = local_b20._0_8_;
      uStack_1258 = local_b20._8_8_;
      uStack_1250 = local_b30._0_8_;
      uStack_1248 = local_b30._8_8_;
      local_1200 = local_1220;
      uStack_11f8 = uStack_1218;
      uStack_11f0 = uStack_1210;
      uStack_11e8 = uStack_1208;
      local_11c0 = uVar9;
      uStack_11b8 = uVar10;
      local_1100 = local_1120;
      local_e20 = local_1000;
      uStack_e18 = uStack_ff8;
      uStack_e10 = uStack_ff0;
      uStack_e08 = uStack_fe8;
      local_cc0 = local_12c0._0_8_;
      uStack_cb8 = local_12c0._8_8_;
      uStack_cb0 = local_12c0._16_8_;
      uStack_ca8 = local_12c0._24_8_;
    }
    for (; local_15d8 = local_1738, local_17c8 = local_1638, local_17f8 + 3 < local_1790;
        local_17f8 = local_17f8 + 4) {
      local_1688 = local_17a0;
      local_1660 = *(undefined8 *)*local_17a0;
      uStack_1658 = *(undefined8 *)(*local_17a0 + 8);
      local_694 = 0x3f800000;
      local_6b0 = 0x3f800000;
      local_1670 = 0x3f8000003f800000;
      uStack_1668 = 0x3f8000003f800000;
      local_6b4 = 0x40000000;
      local_6d0 = 0x40000000;
      local_1680 = 0x4000000040000000;
      uStack_1678 = 0x4000000040000000;
      local_640._0_4_ = (float)local_1660;
      local_640._4_4_ = (float)((ulong)local_1660 >> 0x20);
      uStack_638._0_4_ = (float)uStack_1658;
      uStack_638._4_4_ = (float)((ulong)uStack_1658 >> 0x20);
      local_620 = (float)local_640 * 2.0;
      fStack_61c = local_640._4_4_ * 2.0;
      fStack_618 = (float)uStack_638 * 2.0;
      fStack_614 = uStack_638._4_4_ * 2.0;
      local_5f4 = 0x3f800000;
      local_610 = 0x3f800000;
      local_630 = 0x3f8000003f800000;
      uStack_628 = 0x3f8000003f800000;
      local_5c0._8_8_ = 0x3f8000003f800000;
      local_5c0._0_8_ = 0x3f8000003f800000;
      local_410 = ZEXT816(0) << 0x20;
      local_5e0 = 0;
      local_400._8_8_ = SUB168(ZEXT816(0),4);
      uStack_5d8 = local_400._8_8_;
      local_5f0 = CONCAT44(fStack_61c,local_620);
      uStack_5e8 = CONCAT44(fStack_614,fStack_618);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_400._8_8_;
      auVar28._8_8_ = uStack_5e8;
      auVar28._0_8_ = local_5f0;
      auVar1 = vsubps_avx(auVar47 << 0x40,auVar28);
      local_560 = 0x3f8000003f800000;
      uStack_558 = 0x3f8000003f800000;
      local_520._0_8_ = auVar1._0_8_;
      local_3e0 = local_520._0_8_;
      local_520._8_8_ = auVar1._8_8_;
      uStack_3d8 = local_520._8_8_;
      local_3f0 = 0x42b0c0a542b0c0a5;
      uStack_3e8 = 0x42b0c0a542b0c0a5;
      auVar32._8_8_ = 0x42b0c0a542b0c0a5;
      auVar32._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar32);
      local_520._0_8_ = auVar1._0_8_;
      local_3c0 = local_520._0_8_;
      local_520._8_8_ = auVar1._8_8_;
      uStack_3b8 = local_520._8_8_;
      local_3d0 = 0xc2b0c0a5c2b0c0a5;
      uStack_3c8 = 0xc2b0c0a5c2b0c0a5;
      auVar33._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar33._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2 = vmaxps_avx(auVar1,auVar33);
      local_520._0_8_ = auVar2._0_8_;
      uVar7 = local_520._0_8_;
      local_520._8_8_ = auVar2._8_8_;
      uVar8 = local_520._8_8_;
      local_470 = 0x3fb8aa3b3fb8aa3b;
      uStack_468 = 0x3fb8aa3b3fb8aa3b;
      local_460._0_4_ = auVar2._0_4_;
      local_460._4_4_ = auVar2._4_4_;
      uStack_458._0_4_ = auVar2._8_4_;
      uStack_458._4_4_ = auVar2._12_4_;
      local_540._4_4_ = local_460._4_4_ * 1.442695;
      local_540._0_4_ = (float)local_460 * 1.442695;
      uStack_538._0_4_ = (float)uStack_458 * 1.442695;
      uStack_538._4_4_ = uStack_458._4_4_ * 1.442695;
      local_420 = local_540;
      uStack_418 = uStack_538;
      local_430 = 0x3f0000003f000000;
      uStack_428 = 0x3f0000003f000000;
      local_540._0_4_ = (float)local_460 * 1.442695 + 0.5;
      local_540._4_4_ = local_460._4_4_ * 1.442695 + 0.5;
      fVar50 = (float)uStack_458 * 1.442695 + 0.5;
      fVar51 = uStack_458._4_4_ * 1.442695 + 0.5;
      uStack_538._0_4_ = fVar50;
      uStack_538._4_4_ = fVar51;
      local_3a0 = local_540;
      uStack_398 = uStack_538;
      local_550._4_4_ = (int)(float)local_540._4_4_;
      local_550._0_4_ = (int)(float)local_540._0_4_;
      local_550._8_4_ = (int)fVar50;
      local_550._12_4_ = (int)fVar51;
      local_390 = local_550._0_8_;
      uStack_388 = local_550._8_8_;
      auVar34._8_8_ = local_550._8_8_;
      auVar34._0_8_ = local_550._0_8_;
      auVar6 = vcvtdq2ps_avx(auVar34);
      local_530 = auVar6._0_8_;
      local_370 = local_530;
      uStack_528 = auVar6._8_8_;
      uStack_368 = uStack_528;
      local_380 = local_540;
      uStack_378 = uStack_538;
      auVar35._8_8_ = uStack_538;
      auVar35._0_8_ = local_540;
      auVar1 = vcmpps_avx(auVar35,auVar6,1);
      local_570._0_8_ = auVar1._0_8_;
      local_350 = local_570._0_8_;
      local_570._8_8_ = auVar1._8_8_;
      uStack_348 = local_570._8_8_;
      local_360 = 0x3f8000003f800000;
      uStack_358 = 0x3f8000003f800000;
      auVar36._8_8_ = 0x3f8000003f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      local_570 = vpand_avx(auVar1,auVar36);
      local_4c0 = local_530;
      uStack_4b8 = uStack_528;
      local_4d0 = local_570._0_8_;
      uStack_4c8 = local_570._8_8_;
      _local_540 = vsubps_avx(auVar6,local_570);
      local_2f0 = local_540;
      uStack_2e8 = uStack_538;
      local_310 = local_520._0_8_;
      uStack_308 = local_520._8_8_;
      local_300 = 0x3f3180003f318000;
      uStack_2f8 = 0x3f3180003f318000;
      local_190 = local_540;
      uStack_188 = uStack_538;
      local_1a0 = 0x3f3180003f318000;
      uStack_198 = 0x3f3180003f318000;
      local_1b0 = local_520._0_8_;
      uStack_1a8 = local_520._8_8_;
      auVar37._8_8_ = 0x3f3180003f318000;
      auVar37._0_8_ = 0x3f3180003f318000;
      auVar1 = vfnmadd213ps_fma(auVar37,_local_540,auVar2);
      local_320 = local_540;
      uStack_318 = uStack_538;
      local_520._0_8_ = auVar1._0_8_;
      local_340 = local_520._0_8_;
      local_520._8_8_ = auVar1._8_8_;
      uStack_338 = local_520._8_8_;
      local_330 = 0xb95e8083b95e8083;
      uStack_328 = 0xb95e8083b95e8083;
      local_160 = local_540;
      uStack_158 = uStack_538;
      local_170 = 0xb95e8083b95e8083;
      uStack_168 = 0xb95e8083b95e8083;
      local_180 = local_520._0_8_;
      uStack_178 = local_520._8_8_;
      auVar38._8_8_ = 0xb95e8083b95e8083;
      auVar38._0_8_ = 0xb95e8083b95e8083;
      local_520 = vfnmadd213ps_fma(auVar38,_local_540,auVar1);
      local_490 = local_520._0_8_;
      uStack_488 = local_520._8_8_;
      local_480._0_4_ = local_520._0_4_;
      local_480._4_4_ = local_520._4_4_;
      uStack_478._0_4_ = local_520._8_4_;
      uStack_478._4_4_ = local_520._12_4_;
      local_530 = CONCAT44(local_480._4_4_ * local_480._4_4_,(float)local_480 * (float)local_480);
      uStack_528._0_4_ = (float)uStack_478 * (float)uStack_478;
      uStack_528._4_4_ = uStack_478._4_4_ * uStack_478._4_4_;
      local_1d0 = 0x3950696739506967;
      uStack_1c8 = 0x3950696739506967;
      local_1e0 = local_520._0_8_;
      uStack_1d8 = local_520._8_8_;
      local_1f0 = 0x3ab743ce3ab743ce;
      uStack_1e8 = 0x3ab743ce3ab743ce;
      local_130 = 0x3950696739506967;
      uStack_128 = 0x3950696739506967;
      local_140 = local_520._0_8_;
      uStack_138 = local_520._8_8_;
      local_150 = 0x3ab743ce3ab743ce;
      uStack_148 = 0x3ab743ce3ab743ce;
      auVar40._8_8_ = 0x3950696739506967;
      auVar40._0_8_ = 0x3950696739506967;
      auVar39._8_8_ = 0x3ab743ce3ab743ce;
      auVar39._0_8_ = 0x3ab743ce3ab743ce;
      auVar1 = vfmadd213ps_fma(local_520,auVar40,auVar39);
      local_580 = auVar1._0_8_;
      local_200 = local_580;
      uStack_578 = auVar1._8_8_;
      uStack_1f8 = uStack_578;
      local_210 = local_520._0_8_;
      uStack_208 = local_520._8_8_;
      local_220 = 0x3c0889083c088908;
      uStack_218 = 0x3c0889083c088908;
      local_100 = local_580;
      uStack_f8 = uStack_578;
      local_110 = local_520._0_8_;
      uStack_108 = local_520._8_8_;
      local_120 = 0x3c0889083c088908;
      uStack_118 = 0x3c0889083c088908;
      auVar41._8_8_ = 0x3c0889083c088908;
      auVar41._0_8_ = 0x3c0889083c088908;
      auVar1 = vfmadd213ps_fma(local_520,auVar1,auVar41);
      local_580 = auVar1._0_8_;
      local_230 = local_580;
      uStack_578 = auVar1._8_8_;
      uStack_228 = uStack_578;
      local_240 = local_520._0_8_;
      uStack_238 = local_520._8_8_;
      local_250 = 0x3d2aa9c13d2aa9c1;
      uStack_248 = 0x3d2aa9c13d2aa9c1;
      local_d0 = local_580;
      uStack_c8 = uStack_578;
      local_e0 = local_520._0_8_;
      uStack_d8 = local_520._8_8_;
      local_f0 = 0x3d2aa9c13d2aa9c1;
      uStack_e8 = 0x3d2aa9c13d2aa9c1;
      auVar42._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar42._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar1 = vfmadd213ps_fma(local_520,auVar1,auVar42);
      local_580 = auVar1._0_8_;
      local_260 = local_580;
      uStack_578 = auVar1._8_8_;
      uStack_258 = uStack_578;
      local_270 = local_520._0_8_;
      uStack_268 = local_520._8_8_;
      local_280 = 0x3e2aaaaa3e2aaaaa;
      uStack_278 = 0x3e2aaaaa3e2aaaaa;
      local_a0 = local_580;
      uStack_98 = uStack_578;
      local_b0 = local_520._0_8_;
      uStack_a8 = local_520._8_8_;
      local_c0 = 0x3e2aaaaa3e2aaaaa;
      uStack_b8 = 0x3e2aaaaa3e2aaaaa;
      auVar43._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar43._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar1 = vfmadd213ps_fma(local_520,auVar1,auVar43);
      local_580 = auVar1._0_8_;
      local_290 = local_580;
      uStack_578 = auVar1._8_8_;
      uStack_288 = uStack_578;
      local_2a0 = local_520._0_8_;
      uStack_298 = local_520._8_8_;
      local_70 = local_580;
      uStack_68 = uStack_578;
      local_80 = local_520._0_8_;
      uStack_78 = local_520._8_8_;
      local_90 = 0x3f0000003f000000;
      uStack_88 = 0x3f0000003f000000;
      auVar44._8_8_ = 0x3f0000003f000000;
      auVar44._0_8_ = 0x3f0000003f000000;
      auVar1 = vfmadd213ps_fma(local_520,auVar1,auVar44);
      local_580 = auVar1._0_8_;
      local_2c0 = local_580;
      uStack_578 = auVar1._8_8_;
      uStack_2b8 = uStack_578;
      local_2d0 = local_530;
      uStack_2c8 = uStack_528;
      local_2e0 = local_520._0_8_;
      uStack_2d8 = local_520._8_8_;
      local_40 = local_580;
      uStack_38 = uStack_578;
      local_50 = local_530;
      uStack_48 = uStack_528;
      local_60 = local_520._0_8_;
      uStack_58 = local_520._8_8_;
      auVar45._8_8_ = uStack_528;
      auVar45._0_8_ = local_530;
      auVar1 = vfmadd213ps_fma(auVar45,auVar1,local_520);
      local_580 = auVar1._0_8_;
      uVar9 = local_580;
      uStack_578 = auVar1._8_8_;
      uVar10 = uStack_578;
      local_450 = 0x3f8000003f800000;
      uStack_448 = 0x3f8000003f800000;
      local_440._0_4_ = auVar1._0_4_;
      local_440._4_4_ = auVar1._4_4_;
      uStack_438._0_4_ = auVar1._8_4_;
      uStack_438._4_4_ = auVar1._12_4_;
      local_580._4_4_ = local_440._4_4_ + 1.0;
      local_580._0_4_ = (float)local_440 + 1.0;
      uStack_578._0_4_ = (float)uStack_438 + 1.0;
      uStack_578._4_4_ = uStack_438._4_4_ + 1.0;
      local_3b0._0_4_ = local_540._0_4_;
      local_3b0._4_4_ = local_540._4_4_;
      uStack_3a8._0_4_ = local_540._8_4_;
      uStack_3a8._4_4_ = local_540._12_4_;
      local_550._4_4_ = (int)local_3b0._4_4_;
      local_550._0_4_ = (int)(float)local_3b0;
      local_550._8_4_ = (int)(float)uStack_3a8;
      local_550._12_4_ = (int)uStack_3a8._4_4_;
      local_500 = local_550._0_8_;
      uStack_4f8 = local_550._8_8_;
      local_510 = 0x7f0000007f;
      uStack_508 = 0x7f0000007f;
      auVar31._8_8_ = local_550._8_8_;
      auVar31._0_8_ = local_550._0_8_;
      auVar30._8_8_ = 0x7f0000007f;
      auVar30._0_8_ = 0x7f0000007f;
      auVar1 = vpaddd_avx(auVar31,auVar30);
      local_550._0_8_ = auVar1._0_8_;
      local_4e0 = local_550._0_8_;
      local_550._8_8_ = auVar1._8_8_;
      uStack_4d8 = local_550._8_8_;
      local_4e4 = 0x17;
      local_550 = vpslld_avx(auVar1,ZEXT416(0x17));
      local_1c0 = local_550._0_8_;
      uStack_1b8 = local_550._8_8_;
      local_590 = local_550._0_8_;
      uStack_588 = local_550._8_8_;
      local_4a0 = _local_580;
      local_4b0._0_4_ = local_550._0_4_;
      local_4b0._4_4_ = local_550._4_4_;
      uStack_4a8._0_4_ = local_550._8_4_;
      uStack_4a8._4_4_ = local_550._12_4_;
      local_580._0_4_ = ((float)local_440 + 1.0) * (float)local_4b0;
      local_580._4_4_ = (local_440._4_4_ + 1.0) * local_4b0._4_4_;
      uStack_4a8._0_4_ = ((float)uStack_438 + 1.0) * (float)uStack_4a8;
      uStack_4a8._4_4_ = (uStack_438._4_4_ + 1.0) * uStack_4a8._4_4_;
      uStack_578._0_4_ = (float)uStack_4a8;
      uStack_578._4_4_ = uStack_4a8._4_4_;
      local_5b0 = local_580;
      uStack_5a8 = uStack_578;
      local_5d0 = (float)local_580._0_4_ + 1.0;
      fStack_5cc = (float)local_580._4_4_ + 1.0;
      fStack_5c8 = (float)uStack_4a8 + 1.0;
      fStack_5c4 = uStack_4a8._4_4_ + 1.0;
      auVar29._4_4_ = fStack_5cc;
      auVar29._0_4_ = local_5d0;
      auVar29._8_4_ = fStack_5c8;
      auVar29._12_4_ = fStack_5c4;
      _local_660 = vdivps_avx(local_5c0,auVar29);
      local_680._0_4_ = (float)local_660._0_4_ * 2.0;
      local_680._4_4_ = (float)local_660._4_4_ * 2.0;
      local_680._8_4_ = fStack_658 * 2.0;
      local_680._12_4_ = fStack_654 * 2.0;
      auVar6._8_8_ = 0x3f8000003f800000;
      auVar6._0_8_ = 0x3f8000003f800000;
      auVar1 = vsubps_avx(local_680,auVar6);
      local_1640 = local_17a0;
      local_1830 = auVar1._0_8_;
      local_1650 = local_1830;
      uStack_1828 = auVar1._8_8_;
      uStack_1648 = uStack_1828;
      *(undefined1 (*) [16])*local_17a0 = auVar1;
      local_17a0 = (undefined1 (*) [32])(*local_17a0 + 0x10);
      uStack_6cc = local_6d0;
      uStack_6c8 = local_6d0;
      uStack_6c4 = local_6d0;
      uStack_6ac = local_6b0;
      uStack_6a8 = local_6b0;
      uStack_6a4 = local_6b0;
      local_690 = local_1670;
      uStack_688 = uStack_1668;
      local_670 = local_1680;
      uStack_668 = uStack_1678;
      local_650 = local_1680;
      uStack_648 = uStack_1678;
      local_640 = local_1660;
      uStack_638 = uStack_1658;
      uStack_60c = local_610;
      uStack_608 = local_610;
      uStack_604 = local_610;
      local_5a0 = local_5c0;
      local_4b0 = local_550._0_8_;
      uStack_4a8 = local_550._8_8_;
      local_480 = local_490;
      uStack_478 = uStack_488;
      local_460 = uVar7;
      uStack_458 = uVar8;
      local_440 = uVar9;
      uStack_438 = uVar10;
      local_400 = local_410;
      local_3b0 = local_540;
      uStack_3a8 = uStack_538;
      local_2b0 = local_430;
      uStack_2a8 = uStack_428;
    }
    for (; local_17f8 < local_1790; local_17f8 = local_17f8 + 1) {
      dVar48 = std::tanh((double)(ulong)*(uint *)*local_17a0);
      *(int *)*local_17a0 = SUB84(dVar48,0);
      local_17a0 = (undefined1 (*) [32])(*local_17a0 + 4);
    }
  }
  return 0;
}

Assistant:

int TanH_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}